

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O1

void sdf_tools::die(char *file,int line,char *pattern,...)

{
  char in_AL;
  runtime_error *this;
  undefined8 in_RCX;
  __va_list_tag *args_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string errMsg;
  va_list args;
  string local_128;
  string local_108;
  char local_e8 [8];
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  args_00 = (__va_list_tag *)(ulong)(uint)line;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  utils::strprintf_abi_cxx11_(&local_108,"[sdf_tools] %s:%d:\n",file);
  local_e0 = &stack0x00000008;
  local_e8[0] = '\x18';
  local_e8[1] = '\0';
  local_e8[2] = '\0';
  local_e8[3] = '\0';
  local_e8[4] = '0';
  local_e8[5] = '\0';
  local_e8[6] = '\0';
  local_e8[7] = '\0';
  local_d8 = local_c8;
  utils::vstrprintf_abi_cxx11_(&local_128,(utils *)pattern,local_e8,args_00);
  std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_128._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)&local_108);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void die(const char *file, int line, const char* pattern, ...)
{
    std::string errMsg = utils::strprintf("[sdf_tools] %s:%d:\n", file, line);

    va_list args;
    va_start(args, pattern);
    errMsg += utils::vstrprintf(pattern, args);
    va_end(args);

    throw std::runtime_error(errMsg);
}